

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void aom_highbd_dc_predictor_8x4_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  uint16_t *in_RCX;
  uint16_t *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  short extraout_XMM0_Wb;
  short extraout_XMM0_Wb_00;
  __m128i row;
  uint32_t sum32;
  __m128i sum;
  __m128i sum_above;
  __m128i sum_left;
  undefined2 local_15c;
  
  dc_sum_4(in_RCX);
  dc_sum_8(in_RDX);
  local_15c = (undefined2)(((ushort)(extraout_XMM0_Wb_00 + extraout_XMM0_Wb) + 6) / 0xc);
  uVar1 = CONCAT26(local_15c,CONCAT24(local_15c,CONCAT22(local_15c,local_15c)));
  uVar2 = CONCAT26(local_15c,CONCAT24(local_15c,CONCAT22(local_15c,local_15c)));
  *in_RDI = uVar1;
  in_RDI[1] = uVar2;
  puVar3 = (undefined8 *)(in_RSI * 2 + (long)in_RDI);
  *puVar3 = uVar1;
  puVar3[1] = uVar2;
  puVar3 = (undefined8 *)(in_RSI * 2 + (long)puVar3);
  *puVar3 = uVar1;
  puVar3[1] = uVar2;
  puVar3 = (undefined8 *)(in_RSI * 2 + (long)puVar3);
  *puVar3 = uVar1;
  puVar3[1] = uVar2;
  return;
}

Assistant:

void aom_highbd_dc_predictor_8x4_sse2(uint16_t *dst, ptrdiff_t stride,
                                      const uint16_t *above,
                                      const uint16_t *left, int bd) {
  (void)bd;
  const __m128i sum_left = dc_sum_4(left);
  const __m128i sum_above = dc_sum_8(above);
  const __m128i sum = _mm_add_epi16(sum_above, sum_left);
  uint32_t sum32 = (uint32_t)_mm_cvtsi128_si32(sum);
  sum32 >>= 16;
  sum32 += 6;
  sum32 /= 12;
  const __m128i row = _mm_set1_epi16((int16_t)sum32);

  _mm_store_si128((__m128i *)dst, row);
  dst += stride;
  _mm_store_si128((__m128i *)dst, row);
  dst += stride;
  _mm_store_si128((__m128i *)dst, row);
  dst += stride;
  _mm_store_si128((__m128i *)dst, row);
}